

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O0

void __thiscall
QHttp2ProtocolHandler::finishStreamWithError
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,Http2Error errorCode)

{
  long lVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  QHttp2ProtocolHandler *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_00000018;
  QString message;
  NetworkError error;
  QString *in_stack_000000a0;
  NetworkError *in_stack_000000a8;
  quint32 in_stack_000000b0;
  undefined4 in_stack_ffffffffffffffc0;
  NetworkError error_00;
  
  error_00 = (NetworkError)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)0x2d3f80);
  Http2::qt_error(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  finishStreamWithError
            (in_RDI,(QHttp2Stream *)CONCAT44(errorCode,in_stack_00000018),error_00,
             (QString *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0));
  QString::~QString((QString *)0x2d3fb5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::finishStreamWithError(QHttp2Stream *stream, Http2Error errorCode)
{
    QNetworkReply::NetworkError error = QNetworkReply::NoError;
    QString message;
    qt_error(errorCode, error, message);
    finishStreamWithError(stream, error, message);
}